

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_char_*const_&,_char_*const_&> * __thiscall
Catch::ExprLhs<char_const*const&>::operator==
          (BinaryExpr<const_char_*const_&,_char_*const_&> *__return_storage_ptr__,
          ExprLhs<char_const*const&> *this,char **rhs)

{
  char **ppcVar1;
  char *pcVar2;
  char *pcVar3;
  StringRef local_40;
  
  ppcVar1 = *(char ***)this;
  pcVar2 = *ppcVar1;
  pcVar3 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = pcVar2 == pcVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0019cbd8;
  __return_storage_ptr__->m_lhs = ppcVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }